

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info.hpp
# Opt level: O0

void __thiscall
duckdb::ProfilingInfo::MetricUpdate<unsigned_long>
          (ProfilingInfo *this,MetricsType type,Value *value,
          function<unsigned_long_(const_unsigned_long_&,_const_unsigned_long_&)> *update_fun)

{
  bool bVar1;
  Value *in_RCX;
  long in_RDI;
  Value *this_00;
  unsigned_long new_value;
  unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
  *in_stack_ffffffffffffff38;
  Value *in_stack_ffffffffffffff40;
  Value *in_stack_ffffffffffffff48;
  unsigned_long *__args;
  function<unsigned_long_(const_unsigned_long_&,_const_unsigned_long_&)> *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_duckdb::MetricsType,_duckdb::Value>,_true> local_30;
  _Node_iterator_base<std::pair<const_duckdb::MetricsType,_duckdb::Value>,_true> local_28;
  Value *local_20;
  unsigned_long local_9;
  
  local_20 = in_RCX;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x9877a7);
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = ::std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    ::std::
    unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
    ::operator[]((unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
                  *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    Value::operator=(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  else {
    this_00 = (Value *)(in_RDI + 0x70);
    __args = &local_9;
    ::std::
    unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
    ::operator[]((unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
                  *)this_00,(key_type *)local_20);
    Value::GetValue<unsigned_long>((Value *)0x987849);
    Value::GetValue<unsigned_long>((Value *)0x98785e);
    ::std::function<unsigned_long_(const_unsigned_long_&,_const_unsigned_long_&)>::operator()
              (in_stack_ffffffffffffff50,__args,(unsigned_long *)this_00);
    Value::CreateValue<unsigned_long>((uint64_t)local_20);
    ::std::
    unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
    ::operator[]((unordered_map<duckdb::MetricsType,_duckdb::Value,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>_>
                  *)this_00,(key_type *)local_20);
    Value::operator=(this_00,local_20);
    Value::~Value(this_00);
  }
  return;
}

Assistant:

void MetricUpdate(const MetricsType type, const Value &value,
	                  const std::function<METRIC_TYPE(const METRIC_TYPE &, const METRIC_TYPE &)> &update_fun) {
		if (metrics.find(type) == metrics.end()) {
			metrics[type] = value;
			return;
		}
		auto new_value = update_fun(metrics[type].GetValue<METRIC_TYPE>(), value.GetValue<METRIC_TYPE>());
		metrics[type] = Value::CreateValue(new_value);
	}